

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::SamplerBindingRenderCase::init
          (SamplerBindingRenderCase *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  RenderContext *pRVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  undefined4 extraout_var;
  pointer puVar6;
  undefined4 extraout_var_00;
  long lVar7;
  Vec4 *color;
  long lVar8;
  TextureLevel level;
  Random rnd;
  allocator_type local_a9;
  long local_a8;
  long local_a0;
  long local_98;
  undefined1 local_90 [40];
  ConstPixelBufferAccess local_68;
  deRandom local_40;
  
  LayoutBindingRenderCase::init(&this->super_LayoutBindingRenderCase,ctx);
  iVar3 = (*((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  local_a8 = CONCAT44(extraout_var,iVar3);
  dVar4 = deStringHash((this->super_LayoutBindingRenderCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_40,dVar4 ^ 0xff23a4);
  local_68.m_format = (TextureFormat)((ulong)local_68.m_format.type << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,
             (long)(this->super_LayoutBindingRenderCase).m_numBindings,
             (value_type_conflict4 *)&local_68,&local_a9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&this->m_textures,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90);
  if ((TextureFormat)local_90._0_8_ != (TextureFormat)0x0) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ - local_90._0_8_);
  }
  if (0 < (int)((ulong)((long)(this->m_textures).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_textures).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2)) {
    iVar3 = 0;
    do {
      getRandomColor((anon_unknown_1 *)local_90,(Random *)&local_40);
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
                 &this->m_textureColors,(Vector<float,_4> *)local_90);
      iVar3 = iVar3 + 1;
    } while (iVar3 < (int)((ulong)((long)(this->m_textures).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->m_textures).
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  (**(code **)(local_a8 + 0x6f8))();
  puVar6 = (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_textures).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar6) >> 2)) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      uVar1 = puVar6[lVar8];
      color = (Vec4 *)((long)((this->m_textureColors).
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar7);
      iVar3 = (this->super_LayoutBindingRenderCase).m_bindings.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [lVar8];
      local_a0 = lVar7;
      iVar5 = (*((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx->
                _vptr_RenderContext[3])();
      lVar7 = CONCAT44(extraout_var_00,iVar5);
      (**(code **)(lVar7 + 8))(iVar3 + 0x84c0);
      (**(code **)(lVar7 + 0xb8))(this->m_textureType,uVar1);
      local_98 = lVar7;
      (**(code **)(lVar7 + 0x1360))(this->m_textureType,0x2801,0x2601);
      if (this->m_textureType == 0x806f) {
        local_68.m_format.order = RGBA;
        local_68.m_format.type = UNORM_INT8;
        tcu::TextureLevel::TextureLevel((TextureLevel *)local_90,&local_68.m_format,1,1,1);
        tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_68,(TextureLevel *)local_90);
        tcu::clear((PixelBufferAccess *)&local_68,color);
        pRVar2 = ((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx;
        dVar4 = this->m_textureType;
        tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_68,(TextureLevel *)local_90);
        glu::texImage3D(pRVar2,dVar4,0,0x8058,&local_68);
LAB_014759b1:
        tcu::TextureLevel::~TextureLevel((TextureLevel *)local_90);
      }
      else if (this->m_textureType == 0xde1) {
        local_68.m_format.order = RGBA;
        local_68.m_format.type = UNORM_INT8;
        tcu::TextureLevel::TextureLevel((TextureLevel *)local_90,&local_68.m_format,1,1,1);
        tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_68,(TextureLevel *)local_90);
        tcu::clear((PixelBufferAccess *)&local_68,color);
        pRVar2 = ((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx;
        dVar4 = this->m_textureType;
        tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_68,(TextureLevel *)local_90);
        glu::texImage2D(pRVar2,dVar4,0,0x8058,&local_68);
        goto LAB_014759b1;
      }
      dVar4 = (**(code **)(local_98 + 0x800))();
      glu::checkError(dVar4,"Texture initialization failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                      ,0x4a2);
      lVar8 = lVar8 + 1;
      puVar6 = (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar7 = local_a0 + 0x10;
    } while (lVar8 < (int)((ulong)((long)(this->m_textures).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6)
                          >> 2));
  }
  iVar3 = (**(code **)(local_a8 + 8))(0x84c0);
  return iVar3;
}

Assistant:

void SamplerBindingRenderCase::init (void)
{
	LayoutBindingRenderCase::init();
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	de::Random				rnd		(deStringHash(getName()) ^ 0xff23a4);


	// Initialize texture resources
	m_textures = std::vector<glw::GLuint>(m_numBindings,  0);

	// Texture colors
	for (int texNdx = 0; texNdx < (int)m_textures.size(); ++texNdx)
		m_textureColors.push_back(getRandomColor(rnd));

	// Textures
	gl.genTextures((glw::GLsizei)m_textures.size(), &m_textures[0]);

	for (int texNdx = 0; texNdx < (int)m_textures.size(); ++texNdx)
		initializeTexture(m_bindings[texNdx], m_textures[texNdx], m_textureColors[texNdx]);

	gl.activeTexture(GL_TEXTURE0);
}